

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O1

void __thiscall rtc::Buffer::EnsureCapacity(Buffer *this,size_t capacity)

{
  uchar *__src;
  ostream *poVar1;
  uchar *__dest;
  pointer __old_p;
  bool bVar2;
  bool bVar3;
  FatalMessage local_318;
  FatalMessage local_1a0;
  
  if (this->capacity_ == 0 ||
      (this->data_)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
      ._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl != (uchar *)0x0) {
    bVar2 = this->size_ <= this->capacity_;
  }
  else {
    bVar2 = false;
  }
  if (bVar2) {
    if (this->capacity_ < capacity) {
      __dest = (uchar *)operator_new__(capacity);
      __src = (this->data_)._M_t.
              super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
              super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      memcpy(__dest,__src,this->size_);
      (this->data_)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
      ._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = __dest;
      if (__src != (uchar *)0x0) {
        operator_delete__(__src);
      }
      this->capacity_ = capacity;
      bVar3 = (this->data_)._M_t.
              super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
              super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl == (uchar *)0x0;
      bVar2 = capacity < this->size_;
      if (bVar2 || bVar3) {
        FatalMessage::FatalMessage
                  (&local_318,
                   "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/buffer.h"
                   ,0xdd);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_318,"Check failed: IsConsistent()",0x1c);
        std::ios::widen((char)&local_318 + (char)*(undefined8 *)(local_318._0_8_ + -0x18));
        std::ostream::put((char)&local_318);
        poVar1 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"# ",2);
        if (bVar2 || bVar3) {
          FatalMessage::~FatalMessage(&local_318);
        }
      }
    }
    return;
  }
  FatalMessage::FatalMessage
            (&local_1a0,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/buffer.h"
             ,0xd6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a0,"Check failed: IsConsistent()",0x1c);
  std::ios::widen((char)(ostream *)&local_1a0 + (char)*(undefined8 *)(local_1a0._0_8_ + -0x18));
  std::ostream::put((char)&local_1a0);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"# ",2);
  FatalMessage::~FatalMessage(&local_1a0);
}

Assistant:

void EnsureCapacity(size_t capacity) {
    RTC_DCHECK(IsConsistent());
    if (capacity <= capacity_)
      return;
    std::unique_ptr<uint8_t[]> new_data(new uint8_t[capacity]);
    std::memcpy(new_data.get(), data_.get(), size_);
    data_ = std::move(new_data);
    capacity_ = capacity;
    RTC_DCHECK(IsConsistent());
  }